

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  write_int_arg<unsigned_int> wVar3;
  int iVar4;
  type tVar5;
  appender *paVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *pbVar7;
  appender aVar8;
  bool bVar9;
  char local_36b;
  char local_369;
  basic_format_specs<char> *specs_local;
  locale_ref loc_local;
  write_int_arg<unsigned_int> arg_local;
  appender out_local;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint local_298;
  uint32_t local_294;
  uint prefix;
  uint abs_value;
  void *local_288;
  write_int_arg<unsigned_int> local_280;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_278;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_270;
  anon_class_32_3_03e05ccd local_268;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_248;
  undefined1 local_240 [8];
  write_int_data<char> data;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_218;
  value_type local_20d;
  uint local_20c;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_208;
  uint p;
  appender it;
  anon_class_8_2_0dfc6556_for_write_digits local_1f0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1e8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1e0;
  anon_class_40_3_03e05ccd local_1d8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1b0;
  undefined1 local_1a8 [8];
  write_int_data<char> data_1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_180;
  value_type local_175;
  uint local_174;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_170;
  uint p_1;
  appender it_1;
  bool local_14c;
  undefined3 uStack_14b;
  anon_class_12_3_01816715_for_write_digits local_144;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_138;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_130;
  anon_class_32_3_03e05ccd local_128;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_108;
  undefined1 local_100 [8];
  write_int_data<char> data_2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_d8;
  value_type local_cd;
  uint local_cc;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_c8;
  uint p_2;
  appender it_2;
  anon_class_8_2_0dfc6556_for_write_digits local_b0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_a0;
  anon_class_32_3_03e05ccd local_98;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_78;
  undefined1 local_70 [8];
  write_int_data<char> data_3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_48;
  value_type local_3d;
  uint local_3c;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_38;
  uint p_3;
  appender it_3;
  anon_class_8_2_0dfc6556_for_write_digits local_20;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_18;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_10;
  
  local_280.abs_value = arg.abs_value;
  local_294 = local_280.abs_value;
  local_280.prefix = arg.prefix;
  local_298 = local_280.prefix;
  _prefix = (buffer<char> *)specs;
  local_288 = loc.locale_;
  local_280 = arg;
  local_278 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(specs->type) {
  case none:
  case dec:
    wVar3 = arg;
    if (((*(ushort *)&specs->field_0x9 >> 8 & 1) == 0) ||
       (uVar1 = local_280.prefix,
       bVar9 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                         ((appender *)&local_278,(ulong)arg & 0xffffffff,uVar1,specs,loc),
       wVar3 = local_280, !bVar9)) {
      local_280 = wVar3;
      iVar4 = count_digits(local_294);
      uVar1 = local_298;
      local_1f0.num_digits = iVar4;
      local_1f0.abs_value = local_294;
      local_1e8.container = local_278.container;
      it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)_prefix;
      if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
        tVar5 = to_unsigned<int>(iVar4);
        paVar6 = reserve<fmt::v8::appender>((appender *)&local_1e8,(ulong)(tVar5 + (uVar1 >> 0x18)))
        ;
        bStack_208.container =
             (paVar6->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
        if (uVar1 != 0) {
          for (local_20c = uVar1 & 0xffffff; local_20c != 0; local_20c = local_20c >> 8) {
            local_20d = (value_type)local_20c;
            local_218.container =
                 (buffer<char> *)appender::operator++((appender *)&stack0xfffffffffffffdf8,0);
            pbVar7 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*
                               (&local_218);
            std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar7,&local_20d);
          }
        }
        bVar2.container = local_1e8.container;
        data.padding = (size_t)bStack_208.container;
        aVar8 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1579:41)>
                ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                          (&local_1f0,(reserve_iterator<fmt::v8::appender>)bStack_208.container);
        local_1e0.container =
             (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar8);
      }
      else {
        write_int_data<char>::write_int_data
                  ((write_int_data<char> *)local_240,iVar4,local_298,
                   (basic_format_specs<char> *)_prefix);
        local_248.container = local_1e8.container;
        local_268.prefix = uVar1;
        local_268.data.size = (size_t)local_240;
        local_268.data.padding = data.size;
        local_268.write_digits = local_1f0;
        local_1e0.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                       (local_1e8.container,
                        it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                        (size_t)local_240,&local_268);
      }
      local_270.container = local_1e0.container;
    }
    else {
      local_270.container = local_278.container;
    }
    break;
  case oct:
    uVar1 = local_280.abs_value;
    iVar4 = count_digits<3,unsigned_int>(uVar1);
    if ((((*(ushort *)((long)&_prefix->ptr_ + 1) >> 7 & 1) != 0) &&
        (*(int *)((long)&_prefix->_vptr_buffer + 4) <= iVar4)) && (local_294 != 0)) {
      prefix_append(&local_298,0x30);
    }
    uVar1 = local_298;
    local_20.num_digits = iVar4;
    local_20.abs_value = local_294;
    local_18.container = local_278.container;
    it_3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)_prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      paVar6 = reserve<fmt::v8::appender>((appender *)&local_18,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_38.container =
           (paVar6->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_3c = uVar1 & 0xffffff; local_3c != 0; local_3c = local_3c >> 8) {
          local_3d = (value_type)local_3c;
          local_48.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffc8,0);
          pbVar7 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_48);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar7,&local_3d);
        }
      }
      bVar2.container = local_18.container;
      data_3.padding = (size_t)bStack_38.container;
      aVar8 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1612:22)>
              ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                        (&local_20,(reserve_iterator<fmt::v8::appender>)bStack_38.container);
      local_10.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar8);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_70,iVar4,local_298,
                 (basic_format_specs<char> *)_prefix);
      local_78.container = local_18.container;
      local_98.prefix = uVar1;
      local_98.data.size = (size_t)local_70;
      local_98.data.padding = data_3.size;
      local_98.write_digits = local_20;
      local_10.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                     (local_18.container,
                      it_3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_70,&local_98);
    }
    local_270.container = local_10.container;
    break;
  case hex_lower:
  case hex_upper:
    bVar9 = specs->type == hex_upper;
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      local_369 = 'X';
      if (!bVar9) {
        local_369 = 'x';
      }
      prefix_append(&local_298,(int)local_369 << 8 | 0x30);
    }
    iVar4 = count_digits<4,unsigned_int>(local_294);
    uVar1 = local_298;
    local_144.num_digits = iVar4;
    local_144.abs_value = local_294;
    local_138.container = local_278.container;
    local_144.upper = bVar9;
    local_144._9_3_ = uStack_14b;
    it_1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)_prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      paVar6 = reserve<fmt::v8::appender>((appender *)&local_138,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_170.container =
           (paVar6->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_174 = uVar1 & 0xffffff; local_174 != 0; local_174 = local_174 >> 8) {
          local_175 = (value_type)local_174;
          local_180.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xfffffffffffffe90,0);
          pbVar7 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_180);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar7,&local_175);
        }
      }
      bVar2.container = local_138.container;
      data_1.padding = (size_t)bStack_170.container;
      aVar8 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1590:41)>
              ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                        (&local_144,(reserve_iterator<fmt::v8::appender>)bStack_170.container);
      local_130.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar8);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_1a8,iVar4,local_298,
                 (basic_format_specs<char> *)_prefix);
      local_1b0.container = local_138.container;
      local_1d8.prefix = uVar1;
      local_1d8.data.size = (size_t)local_1a8;
      local_1d8.data.padding = data_1.size;
      local_1d8.write_digits.abs_value = local_144.abs_value;
      local_1d8.write_digits.num_digits = local_144.num_digits;
      local_1d8.write_digits.upper = local_144.upper;
      local_130.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                     (local_138.container,
                      it_1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_1a8,&local_1d8);
    }
    local_270.container = local_130.container;
    break;
  case bin_lower:
  case bin_upper:
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      local_36b = 'B';
      if (specs->type != bin_upper) {
        local_36b = 'b';
      }
      prefix_append(&local_298,(int)local_36b << 8 | 0x30);
    }
    iVar4 = count_digits<1,unsigned_int>(local_294);
    uVar1 = local_298;
    local_b0.num_digits = iVar4;
    local_b0.abs_value = local_294;
    local_a8.container = local_278.container;
    it_2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)_prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      paVar6 = reserve<fmt::v8::appender>((appender *)&local_a8,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_c8.container =
           (paVar6->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_cc = uVar1 & 0xffffff; local_cc != 0; local_cc = local_cc >> 8) {
          local_cd = (value_type)local_cc;
          local_d8.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffff38,0);
          pbVar7 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_d8);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar7,&local_cd);
        }
      }
      bVar2.container = local_a8.container;
      data_2.padding = (size_t)bStack_c8.container;
      aVar8 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1601:22)>
              ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                        (&local_b0,(reserve_iterator<fmt::v8::appender>)bStack_c8.container);
      local_a0.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar8);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_100,iVar4,local_298,
                 (basic_format_specs<char> *)_prefix);
      local_108.container = local_a8.container;
      local_128.prefix = uVar1;
      local_128.data.size = (size_t)local_100;
      local_128.data.padding = data_2.size;
      local_128.write_digits = local_b0;
      local_a0.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                     (local_a8.container,
                      it_2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_100,&local_128);
    }
    local_270.container = local_a0.container;
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_270.container =
         (buffer<char> *)write_char<char,fmt::v8::appender>(out,(char)arg.abs_value,specs);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_270.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}